

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O3

void cilkos_warning(char *fmt,...)

{
  va_list l;
  
  fflush((FILE *)0x0);
  __fprintf_chk(_stderr,1,"Cilk warning: ");
  __vfprintf_chk(_stderr,1,fmt);
  fflush(_stderr);
  return;
}

Assistant:

COMMON_SYSDEP void cilkos_warning(const char *fmt, ...)
{
    va_list l;
    fflush(NULL);
    fprintf(stderr, "Cilk warning: ");
    va_start(l, fmt);
    vfprintf(stderr, fmt, l);
    va_end(l);
    fflush(stderr);
}